

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint maxSymbolValue;
  uint uVar1;
  ulong nbSeq_00;
  size_t code;
  FSE_CTable *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  undefined4 in_R8D;
  short *in_R9;
  undefined4 in_stack_00000008;
  undefined1 *in_stack_00000010;
  ulong in_stack_00000018;
  size_t in_stack_00000028;
  size_t err_code_4;
  size_t err_code_3;
  size_t NCountSize;
  size_t err_code_2;
  ulong in_stack_00000050;
  U32 tableLog;
  size_t nbSeq_1;
  ZSTD_BuildCTableWksp *wksp;
  size_t err_code_1;
  size_t err_code;
  BYTE *oend;
  BYTE *op;
  size_t in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff98;
  uint maxSymbolValue_00;
  ulong total;
  uint *count_00;
  undefined8 in_stack_ffffffffffffffb0;
  short *in_stack_ffffffffffffffb8;
  size_t local_8;
  
  uVar1 = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  switch(in_R8D) {
  case 0:
    local_8 = FSE_buildCTable_wksp
                        ((FSE_CTable *)err_code_2,(short *)NCountSize,err_code_3._4_4_,
                         (uint)err_code_3,(void *)err_code_4,in_stack_00000028);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = 0;
    }
    break;
  case 1:
    local_8 = FSE_buildCTable_rle(in_RDX,(BYTE)in_stack_00000008);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if (in_RSI == 0) {
        local_8 = 0xffffffffffffffba;
      }
      else {
        *in_RDI = *in_stack_00000010;
        local_8 = 1;
      }
    }
    break;
  case 2:
    nbSeq_00 = in_stack_00000018;
    count_00 = (uint *)err_code_2;
    maxSymbolValue = FSE_optimalTableLog(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,0);
    if (1 < *(uint *)(in_R9 + (ulong)(byte)in_stack_00000010[in_stack_00000018 - 1] * 2)) {
      *(int *)(in_R9 + (ulong)(byte)in_stack_00000010[in_stack_00000018 - 1] * 2) =
           *(int *)(in_R9 + (ulong)(byte)in_stack_00000010[in_stack_00000018 - 1] * 2) + -1;
      nbSeq_00 = nbSeq_00 - 1;
    }
    if (nbSeq_00 < 2) {
      __assert_fail("nbSeq_1 > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c2e,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    if (in_stack_00000050 < 0x4e0) {
      __assert_fail("entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c2f,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    maxSymbolValue_00 = maxSymbolValue;
    total = nbSeq_00;
    ZSTD_useLowProbCount(nbSeq_00);
    local_8 = FSE_normalizeCount(in_stack_ffffffffffffffb8,uVar1,count_00,total,maxSymbolValue_00,
                                 in_stack_ffffffffffffff98);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if (in_RDI + in_RSI < in_RDI) {
        __assert_fail("oend >= op",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4c32,
                      "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                     );
      }
      local_8 = FSE_writeNCount((void *)CONCAT44(in_stack_00000008,in_stack_ffffffffffffff68),
                                nbSeq_00,in_R9,maxSymbolValue,in_stack_ffffffffffffff50);
      uVar1 = ERR_isError(local_8);
      if (uVar1 == 0) {
        code = FSE_buildCTable_wksp
                         ((FSE_CTable *)err_code_2,(short *)NCountSize,err_code_3._4_4_,
                          (uint)err_code_3,(void *)err_code_4,in_stack_00000028);
        uVar1 = ERR_isError(code);
        if (uVar1 != 0) {
          local_8 = code;
        }
      }
    }
    break;
  case 3:
    memcpy(in_RDX,(void *)CONCAT44(err_code_3._4_4_,(uint)err_code_3),NCountSize);
    local_8 = 0;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4c39,
                  "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                 );
  }
  return local_8;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max), "");
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall, "not enough space");
        *op = codeTable[0];
        return 1;
    case set_repeat:
        ZSTD_memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize), "");  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        ZSTD_BuildCTableWksp* wksp = (ZSTD_BuildCTableWksp*)entropyWorkspace;
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        assert(entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp));
        (void)entropyWorkspaceSize;
        FORWARD_IF_ERROR(FSE_normalizeCount(wksp->norm, tableLog, count, nbSeq_1, max, ZSTD_useLowProbCount(nbSeq_1)), "FSE_normalizeCount failed");
        assert(oend >= op);
        {   size_t const NCountSize = FSE_writeNCount(op, (size_t)(oend - op), wksp->norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize, "FSE_writeNCount failed");
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, wksp->norm, max, tableLog, wksp->wksp, sizeof(wksp->wksp)), "FSE_buildCTable_wksp failed");
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC, "impossible to reach");
    }
}